

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O1

int evsig_add(event_base *base,int evsignal,short old,short events,void *p)

{
  int *piVar1;
  int iVar2;
  
  if (0x40 < (uint)evsignal) {
    evsig_add_cold_1();
  }
  if (evsig_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,evsig_base_lock);
  }
  if ((evsig_base != base) && (evsig_base_n_signals_added != 0)) {
    event_warnx("Added a signal to event base %p with signals already added to event_base %p.  Only one can have signals at a time with the %s backend.  The base with the most recently added signal or the most recent event_base_loop() call gets preference; do not rely on this behavior in future Libevent versions."
                ,base,evsig_base,base->evsel->name);
  }
  evsig_base_n_signals_added = (base->sig).ev_n_signals_added + 1;
  evsig_base = base;
  (base->sig).ev_n_signals_added = evsig_base_n_signals_added;
  evsig_base_fd = (base->sig).ev_signal_pair[1];
  if (evsig_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,evsig_base_lock);
  }
  if (event_debug_logging_mask_ != 0) {
    event_debugx_("%s: %d: changing signal handler","evsig_add",(ulong)(uint)evsignal);
  }
  iVar2 = evsig_set_handler_(base,evsignal,evsig_handler);
  if (iVar2 != -1) {
    if ((base->sig).ev_signal_added != 0) {
      return 0;
    }
    iVar2 = event_add_nolock_(&(base->sig).ev_signal,(timeval *)0x0,0);
    if (iVar2 == 0) {
      (base->sig).ev_signal_added = 1;
      return 0;
    }
  }
  if (evsig_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,evsig_base_lock);
  }
  evsig_base_n_signals_added = evsig_base_n_signals_added + -1;
  piVar1 = &(base->sig).ev_n_signals_added;
  *piVar1 = *piVar1 + -1;
  if (evsig_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,evsig_base_lock);
  }
  return -1;
}

Assistant:

static int
evsig_add(struct event_base *base, evutil_socket_t evsignal, short old, short events, void *p)
{
	struct evsig_info *sig = &base->sig;
	(void)p;

	EVUTIL_ASSERT(evsignal >= 0 && evsignal < NSIG);

	/* catch signals if they happen quickly */
	EVSIGBASE_LOCK();
	if (evsig_base != base && evsig_base_n_signals_added) {
		event_warnx("Added a signal to event base %p with signals "
		    "already added to event_base %p.  Only one can have "
		    "signals at a time with the %s backend.  The base with "
		    "the most recently added signal or the most recent "
		    "event_base_loop() call gets preference; do "
		    "not rely on this behavior in future Libevent versions.",
		    base, evsig_base, base->evsel->name);
	}
	evsig_base = base;
	evsig_base_n_signals_added = ++sig->ev_n_signals_added;
	evsig_base_fd = base->sig.ev_signal_pair[1];
	EVSIGBASE_UNLOCK();

	event_debug(("%s: %d: changing signal handler", __func__, (int)evsignal));
	if (evsig_set_handler_(base, (int)evsignal, evsig_handler) == -1) {
		goto err;
	}


	if (!sig->ev_signal_added) {
		if (event_add_nolock_(&sig->ev_signal, NULL, 0))
			goto err;
		sig->ev_signal_added = 1;
	}

	return (0);

err:
	EVSIGBASE_LOCK();
	--evsig_base_n_signals_added;
	--sig->ev_n_signals_added;
	EVSIGBASE_UNLOCK();
	return (-1);
}